

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void utf8_suite::test_C0_C0(void)

{
  char input [5];
  decoder_type decoder;
  value_type local_158 [8];
  undefined4 local_150;
  value local_14c;
  basic_decoder<char> local_148;
  
  local_148.input.tail = local_158 + 4;
  local_158[4] = 0;
  local_158[0] = '\"';
  local_158[1] = -0x40;
  local_158[2] = -0x40;
  local_158[3] = '\"';
  local_148.input.head = local_158;
  memset(&local_148.current,0,0x120);
  local_148.current.code = uninitialized;
  local_148.current.view.head = (const_pointer)0x0;
  local_148.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_148);
  local_14c = local_148.current.code;
  local_150 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7a8,"void utf8_suite::test_C0_C0()",&local_14c,&local_150);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[3]>
            ("decoder.literal()","\"\\\"\\xC0\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7a9,"void utf8_suite::test_C0_C0()",&local_148.current.view,anon_var_dwarf_6acc);
  return;
}

Assistant:

void test_C0_C0()
{
    const char input[] = "\"\xC0\xC0\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_unexpected_token);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "\"\xC0");
}